

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O2

idx_t duckdb_array_type_array_size(duckdb_logical_type type)

{
  idx_t iVar1;
  
  if ((type != (duckdb_logical_type)0x0) && (*type == (_duckdb_logical_type)0x6c)) {
    iVar1 = duckdb::ArrayType::GetSize((LogicalType *)type);
    return iVar1;
  }
  return 0;
}

Assistant:

static bool AssertLogicalTypeId(duckdb_logical_type type, duckdb::LogicalTypeId type_id) {
	if (!type) {
		return false;
	}
	auto &logical_type = *(reinterpret_cast<duckdb::LogicalType *>(type));
	if (logical_type.id() != type_id) {
		return false;
	}
	return true;
}